

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

int PatchCodePtrs(int dummy)

{
  Variant *pVVar1;
  char *pcVar2;
  PClass *pPVar3;
  int iVar4;
  uint statenum;
  FState *state;
  DObject *p;
  PFunction *sym;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar5;
  uint i;
  ulong uVar6;
  FString symname;
  FName local_3c;
  char *local_38;
  
  DPrintf(4,"[CodePtr]\n");
  local_38 = FString::NullString.Nothing;
  do {
    while( true ) {
      while( true ) {
        do {
          do {
            iVar4 = GetLine();
            pcVar2 = Line1;
            if (iVar4 != 1) {
              return iVar4;
            }
            iVar4 = strncasecmp("Frame",Line1,5);
          } while (iVar4 != 0);
          iVar4 = isspace((int)pcVar2[5]);
        } while (iVar4 == 0);
        statenum = atoi(pcVar2 + 5);
        state = FindState(statenum);
        pcVar2 = Line2;
        stripwhite(Line2);
        if (state != (FState *)0x0) break;
        Printf("Frame %d out of range\n",(ulong)statenum);
      }
      iVar4 = strcasecmp(pcVar2,"NULL");
      if (iVar4 != 0) break;
      state->ActionFunc = (VMFunction *)0x0;
    }
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    symname.Chars = local_38;
    if (((byte)(*pcVar2 | 0x20U) == 0x61) && (pcVar2[1] == '_')) {
      FString::operator=(&symname,pcVar2);
    }
    else {
      FString::Format(&symname,"A_%s",pcVar2);
    }
    lVar5 = 4;
    for (uVar6 = 0; pPVar3 = AInventory::RegistrationInfo.MyClass, uVar6 < MBFCodePointers.Count;
        uVar6 = uVar6 + 1) {
      pcVar2 = (MBFCodePointers.Array)->alias;
      iVar4 = strcasecmp(symname.Chars,pcVar2 + lVar5 + -4);
      if (iVar4 == 0) {
        FString::operator=(&symname,FName::NameData.NameArray
                                    [(((CodePointerAlias *)(pcVar2 + lVar5 + -4 + -4))->name).Index]
                                    .Text);
        Printf("%s --> %s\n",(MBFCodePointers.Array)->alias + lVar5 + -4,
               FName::NameData.NameArray[*(int *)((MBFCodePointers.Array)->alias + lVar5 + -8)].Text
              );
      }
      lVar5 = lVar5 + 0x1c;
    }
    FName::FName(&local_3c,&symname);
    p = &PSymbolTable::FindSymbol
                   (&(pPVar3->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                     Symbols,&local_3c,true)->super_DObject;
    sym = dyn_cast<PFunction>(p);
    if (sym == (PFunction *)0x0) {
      Printf("Frame %d: Unknown code pointer \'%s\'\n",(ulong)statenum,Line2);
      iVar4 = extraout_EDX_01;
LAB_00434b10:
      sym = (PFunction *)0x0;
    }
    else if (((~sym->Flags & 6) != 0) ||
            ((pVVar1 = (sym->Variants).Array, iVar4 = extraout_EDX, 3 < (pVVar1->ArgFlags).Count &&
             (((pVVar1->ArgFlags).Array[3] & 1) == 0)))) {
      Printf("Frame %d: Incompatible code pointer \'%s\'\n",(ulong)statenum,Line2);
      iVar4 = extraout_EDX_00;
      goto LAB_00434b10;
    }
    SetPointer(state,sym,iVar4);
    FString::~FString(&symname);
  } while( true );
}

Assistant:

static int PatchCodePtrs (int dummy)
{
	int result;

	DPrintf (DMSG_SPAMMY, "[CodePtr]\n");

	while ((result = GetLine()) == 1)
	{
		if (!strnicmp ("Frame", Line1, 5) && isspace(Line1[5]))
		{
			int frame = atoi (Line1 + 5);
			FState *state = FindState (frame);

			stripwhite (Line2);
			if (state == NULL)
			{
				Printf ("Frame %d out of range\n", frame);
			}
			else if (!stricmp(Line2, "NULL"))
			{
				SetPointer(state, NULL);
			}
			else
			{
				FString symname;


				if ((Line2[0] == 'A' || Line2[0] == 'a') && Line2[1] == '_')
					symname = Line2;
				else
					symname.Format("A_%s", Line2);

				// Let's consider as aliases some redundant MBF pointer
				for (unsigned int i = 0; i < MBFCodePointers.Size(); i++)
				{
					if (!symname.CompareNoCase(MBFCodePointers[i].alias))
					{
						symname = MBFCodePointers[i].name;
						Printf("%s --> %s\n", MBFCodePointers[i].alias, MBFCodePointers[i].name.GetChars());
					}
				}

				// This skips the action table and goes directly to the internal symbol table
				// DEH compatible functions are easy to recognize.
				PFunction *sym = dyn_cast<PFunction>(RUNTIME_CLASS(AInventory)->Symbols.FindSymbol(symname, true));
				if (sym == NULL)
				{
					Printf("Frame %d: Unknown code pointer '%s'\n", frame, Line2);
				}
				else
				{
					TArray<DWORD> &args = sym->Variants[0].ArgFlags;
					if ((sym->Flags & (VARF_Method | VARF_Action)) != (VARF_Method | VARF_Action) || (args.Size() > NAP && !(args[NAP] & VARF_Optional)))
					{
						Printf("Frame %d: Incompatible code pointer '%s'\n", frame, Line2);
						sym = NULL;
					}
				}
				SetPointer(state, sym, frame);
			}
		}
	}
	return result;
}